

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O0

void register_native(Environment *env)

{
  Routine r;
  Routine r_00;
  Object local_c0;
  Routine local_80;
  Routine local_48;
  Environment *local_10;
  Environment *env_local;
  
  local_10 = env;
  getSingleArgRoutine(&local_48,"LoadLibrary");
  r.name = local_48.name;
  r.line = local_48.line;
  r._4_4_ = local_48._4_4_;
  r.arity = local_48.arity;
  r._20_4_ = local_48._20_4_;
  r.arguments = local_48.arguments;
  r.isNative = local_48.isNative;
  r._34_6_ = local_48._34_6_;
  r.code.numStatements = local_48.code.numStatements;
  r.code.blockName = local_48.code.blockName;
  r.code.statements = local_48.code.statements;
  env_routine_put(r,0,local_10);
  getSingleArgRoutine(&local_80,"UnloadLibrary");
  r_00.name = local_80.name;
  r_00.line = local_80.line;
  r_00._4_4_ = local_80._4_4_;
  r_00.arity = local_80.arity;
  r_00._20_4_ = local_80._20_4_;
  r_00.arguments = local_80.arguments;
  r_00.isNative = local_80.isNative;
  r_00._34_6_ = local_80._34_6_;
  r_00.code.numStatements = local_80.code.numStatements;
  r_00.code.blockName = local_80.code.blockName;
  r_00.code.statements = local_80.code.statements;
  env_routine_put(r_00,0,local_10);
  define_cons(local_10);
  load_library(&local_c0,0,(Environment *)0x0,"./libnmath.so");
  return;
}

Assistant:

void register_native(Environment *env){
    env_routine_put(getSingleArgRoutine("LoadLibrary"), 0, env);
    env_routine_put(getSingleArgRoutine("UnloadLibrary"), 0, env);
    define_cons(env);
    load_library(0, NULL, "./libnmath.so");
}